

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moves_sort.cpp
# Opt level: O2

void UpdateRootMove(int num_of_all_movements,Movement *all_movements,Movement *move)

{
  UINT32 UVar1;
  ulong uVar2;
  bool bVar3;
  
  uVar2 = 0;
  if (0 < num_of_all_movements) {
    uVar2 = (ulong)(uint)num_of_all_movements;
  }
  do {
    bVar3 = uVar2 == 0;
    uVar2 = uVar2 - 1;
    if (bVar3) {
      return;
    }
    bVar3 = isMoveEqual(move,all_movements);
    UVar1 = 0x80000000;
    if (bVar3) {
LAB_00107226:
      move->value = UVar1;
    }
    else if (move->value != 0) {
      UVar1 = move->value - 1;
      goto LAB_00107226;
    }
    all_movements = all_movements + 1;
  } while( true );
}

Assistant:

void UpdateRootMove(int num_of_all_movements, Movement* all_movements, Movement& move){
    for(int i = 0; i < num_of_all_movements; i++){
        if(isMoveEqual(move, all_movements[i])){
            move.value = MAX_MOVE_VALUE;
        }
        else if(move.value){
            move.value--;
        }
    }
}